

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O0

FIOBJ fiobj_str_new(char *str,size_t len)

{
  void *__dest;
  int *piVar1;
  fio_str_info_s local_78;
  undefined1 local_60 [4];
  undefined4 local_5c;
  undefined8 local_58;
  undefined1 local_50 [48];
  void *local_20;
  fiobj_str_s *s;
  size_t len_local;
  char *str_local;
  
  s = (fiobj_str_s *)len;
  len_local = (size_t)str;
  __dest = fio_malloc(0x40);
  local_20 = __dest;
  if (__dest == (void *)0x0) {
    perror("ERROR: fiobj string couldn\'t allocate memory");
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  local_60[0] = 0x28;
  local_5c = 1;
  local_58 = 0;
  memset(local_50,0,0x30);
  local_50[0] = 1;
  memcpy(__dest,local_60,0x40);
  if ((len_local != 0) && (s != (fiobj_str_s *)0x0)) {
    fio_str_write(&local_78,(fio_str_s_conflict *)((long)local_20 + 0x10),(void *)len_local,
                  (size_t)s);
  }
  return (ulong)local_20 | 2;
}

Assistant:

FIOBJ fiobj_str_new(const char *str, size_t len) {
  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (str && len) {
    fio_str_write(&s->str, str, len);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}